

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

UEnumeration * ucurr_openISOCurrencies_63(uint32_t currType,UErrorCode *pErrorCode)

{
  uint32_t *puVar1;
  UCurrencyContext *myContext;
  UEnumeration *myEnum;
  UErrorCode *pErrorCode_local;
  UEnumeration *pUStack_10;
  uint32_t currType_local;
  
  pUStack_10 = (UEnumeration *)uprv_malloc_63(0x38);
  if (pUStack_10 == (UEnumeration *)0x0) {
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    pUStack_10 = (UEnumeration *)0x0;
  }
  else {
    memcpy(pUStack_10,&gEnumCurrencyList,0x38);
    puVar1 = (uint32_t *)uprv_malloc_63(8);
    if (puVar1 == (uint32_t *)0x0) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      uprv_free_63(pUStack_10);
      pUStack_10 = (UEnumeration *)0x0;
    }
    else {
      *puVar1 = currType;
      puVar1[1] = 0;
      pUStack_10->context = puVar1;
    }
  }
  return pUStack_10;
}

Assistant:

U_CAPI UEnumeration * U_EXPORT2
ucurr_openISOCurrencies(uint32_t currType, UErrorCode *pErrorCode) {
    UEnumeration *myEnum = NULL;
    UCurrencyContext *myContext;

    myEnum = (UEnumeration*)uprv_malloc(sizeof(UEnumeration));
    if (myEnum == NULL) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    uprv_memcpy(myEnum, &gEnumCurrencyList, sizeof(UEnumeration));
    myContext = (UCurrencyContext*)uprv_malloc(sizeof(UCurrencyContext));
    if (myContext == NULL) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
        uprv_free(myEnum);
        return NULL;
    }
    myContext->currType = currType;
    myContext->listIdx = 0;
    myEnum->context = myContext;
    return myEnum;
}